

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void verb_prog_ilopheth_bush(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *in_RDX;
  CHAR_DATA *in_RSI;
  ROOM_INDEX_DATA *room;
  CHAR_DATA *in_stack_00000030;
  char *in_stack_00005c30;
  CHAR_DATA *in_stack_00005c38;
  void *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  int vnum;
  
  if (in_RSI->fighting == (CHAR_DATA *)0x0) {
    send_to_char((char *)in_RSI,in_RDX);
    act((char *)in_RSI,in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
    vnum = (int)((ulong)in_RDX >> 0x20);
    get_room_index(vnum);
    char_from_room(in_stack_00000030);
    char_to_room((CHAR_DATA *)argument,room);
    do_look(in_stack_00005c38,in_stack_00005c30);
    WAIT_STATE(in_RSI,vnum);
  }
  else {
    send_to_char((char *)in_RSI,in_RDX);
  }
  return;
}

Assistant:

void verb_prog_ilopheth_bush(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *room;

	if (ch->fighting)
	{
		send_to_char("You're otherwise occupied right now.\n\r", ch);
		return;
	}

	send_to_char("With a mighty effort, you duck your head and push through the bushes to the west.\n\r", ch);
	act("With a mighty effort, $n ducks $s head and pushes through the bushes to the west.", ch, 0, 0, TO_ROOM);

	room = get_room_index(9096);

	char_from_room(ch);
	char_to_room(ch, room);
	do_look(ch, "auto");

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}